

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O1

PtexCachedReader * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::tryInsert
          (PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*> *this,StringKey *key,
          PtexCachedReader *value,size_t *newMemUsed)

{
  Entry *this_00;
  uint32_t uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  Entry *pEVar5;
  char *__dest;
  uint32_t i;
  uint uVar6;
  PtexCachedReader *pPVar7;
  
  pEVar5 = lockEntriesAndGrowIfNeeded(this,newMemUsed);
  uVar1 = this->_numEntries;
  uVar6 = key->_hash;
  pPVar7 = (PtexCachedReader *)0x0;
  do {
    uVar4 = uVar6 & uVar1 - 1;
    this_00 = pEVar5 + uVar4;
    if (pEVar5[uVar4].value == (PtexCachedReader *)0x0) {
      this_00->value = value;
      this->_size = this->_size + 1;
      __dest = (char *)operator_new__((ulong)(key->_len + 1));
      memcpy(__dest,key->_val,(ulong)(key->_len + 1));
      (this_00->key)._val = __dest;
      (this_00->key)._len = key->_len;
      (this_00->key)._hash = key->_hash;
      (this_00->key)._ownsVal = true;
LAB_0010f6cd:
      pPVar7 = this_00->value;
      bVar2 = false;
    }
    else {
      do {
      } while ((this_00->key)._val == (char *)0x0);
      bVar3 = StringKey::matches(&this_00->key,key);
      bVar2 = true;
      if (bVar3) goto LAB_0010f6cd;
    }
    uVar6 = uVar6 + 1;
    if (!bVar2) {
      this->_entries = pEVar5;
      return pPVar7;
    }
  } while( true );
}

Assistant:

Value tryInsert(Key& key, Value value, size_t& newMemUsed)
    {
        Entry* entries = lockEntriesAndGrowIfNeeded(newMemUsed);
        uint32_t mask = _numEntries-1;
        uint32_t hash = key.hash();

        Value result = 0;
        for (uint32_t i = hash;; ++i) {
            Entry& e = entries[i & mask];
            if (e.value == 0) {
                e.value = value;
                ++_size;
                PtexMemoryFence();
                e.key.copy(key);
                result = e.value;
                break;
            }
            while (e.key.isEmpty()) ;
            if (e.key.matches(key)) {
                result = e.value;
                break;
            }
        }
        unlockEntries(entries);
        return result;
    }